

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  result rVar7;
  decimal_fp<float> dVar8;
  byte bVar9;
  long lVar10;
  undefined8 extraout_RDX;
  size_t count;
  ulong uVar11;
  ulong uVar12;
  uint64_t error;
  size_t __len;
  ulong uVar13;
  uint64_t uVar14;
  ulong uVar15;
  fp fVar16;
  fp fVar17;
  decimal_fp<double> dVar18;
  ulong uStack_90;
  int local_80;
  int cached_exp10;
  uint64_t local_78;
  fixed_handler handler;
  fp local_40;
  
  uVar11 = (ulong)specs & 0xff00000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar11 != 0x200000000) {
      handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
      buffer<char>::push_back(buf,(char *)&handler);
      local_80 = 0;
    }
    else {
      buffer<char>::try_resize(buf,(ulong)(uint)precision);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      local_80 = -precision;
    }
  }
  else {
    uVar5 = specs._4_4_;
    if ((uVar5 >> 0x13 & 1) == 0) {
      iVar6 = snprintf_float<double>(value,precision,specs,buf);
      return iVar6;
    }
    if (precision < 0) {
      if ((uVar5 >> 0x12 & 1) == 0) {
        dVar18 = dragonbox::to_decimal<double>(value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)buf,dVar18.significand);
        local_80 = dVar18.exponent;
      }
      else {
        dVar8 = dragonbox::to_decimal<float>((float)value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)buf,dVar8.significand);
        local_80 = dVar8.exponent;
      }
    }
    else {
      cached_exp10 = 0;
      fp::assign<double,_0>(&local_40,value);
      fVar16.f = (ulong)(uint)local_40.e;
      fVar16._8_8_ = extraout_RDX;
      fVar16 = normalize<0>((detail *)local_40.f,fVar16);
      fVar17 = get_cached_power(-0x7c - fVar16.e,&cached_exp10);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = fVar17.f;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar16.f;
      uVar13 = SUB168(auVar1 * auVar2,8) - (SUB168(auVar1 * auVar2,0) >> 0x3f);
      iVar6 = fVar17.e + fVar16.e;
      handler.precision = 0x2ff;
      if ((uint)precision < 0x2ff) {
        handler.precision = precision;
      }
      handler.buf = buf->ptr_;
      handler.size = 0;
      handler.exp10 = -cached_exp10;
      local_78 = CONCAT44(local_78._4_4_,iVar6);
      bVar9 = -(char)iVar6;
      uVar14 = 1L << (bVar9 & 0x3f);
      uVar12 = uVar13 >> (bVar9 & 0x3f);
      handler.fixed = uVar11 == 0x200000000;
      local_80 = count_digits((uint32_t)uVar12);
      rVar7 = fixed_handler::on_start
                        (&handler,*(long *)(basic_data<void>::grisu_pow10_exponents +
                                           (long)local_80 * 8 + 0xa8) << (bVar9 & 0x3f),uVar13 / 10,
                         10,&local_80);
      if (rVar7 == more) {
        bVar9 = -(char)local_78 - 0x40;
        uVar15 = uVar14 - 1;
        uVar13 = uVar13 & uVar15;
        error = 1;
        local_78 = uVar14;
        do {
          iVar6 = local_80 + -1;
          switch(iVar6) {
          case 0:
            cVar4 = (char)uVar12;
            uVar12 = 0;
            goto LAB_00118dd5;
          case 1:
            uStack_90 = 10;
            break;
          case 2:
            uStack_90 = 100;
            break;
          case 3:
            uStack_90 = 1000;
            break;
          case 4:
            uStack_90 = 10000;
            break;
          case 5:
            uStack_90 = 100000;
            break;
          case 6:
            uStack_90 = 1000000;
            break;
          case 7:
            uStack_90 = 10000000;
            break;
          case 8:
            uStack_90 = 100000000;
            break;
          case 9:
            uStack_90 = 1000000000;
            break;
          default:
            cVar4 = '\0';
            goto LAB_00118dd5;
          }
          cVar4 = (char)((uVar12 & 0xffffffff) / uStack_90);
          uVar12 = (uVar12 & 0xffffffff) % uStack_90;
LAB_00118dd5:
          lVar10 = (long)local_80;
          local_80 = iVar6;
          rVar7 = fixed_handler::on_digit
                            (&handler,cVar4 + '0',
                             *(long *)(basic_data<void>::grisu_pow10_exponents + lVar10 * 8 + 0xa8)
                             << (bVar9 & 0x3f),((uVar12 & 0xffffffff) << (bVar9 & 0x3f)) + uVar13,1,
                             iVar6,true);
          uVar14 = local_78;
          if (rVar7 != more) goto LAB_00118e6c;
        } while (0 < local_80);
        do {
          uVar12 = uVar13 * 10;
          error = error * 10;
          uVar13 = uVar12 & uVar15;
          local_80 = local_80 + -1;
          rVar7 = fixed_handler::on_digit
                            (&handler,(char)(uVar12 >> (bVar9 & 0x3f)) + '0',uVar14,uVar13,error,
                             local_80,false);
        } while (rVar7 == more);
      }
LAB_00118e6c:
      if (rVar7 == error) {
        local_80 = local_80 + ~cached_exp10 + handler.size;
        fallback_format<double>
                  (value,handler.precision,(bool)((byte)((ulong)specs >> 0x32) & 1),buf,&local_80);
      }
      else {
        local_80 = local_80 + handler.exp10;
        buffer<char>::try_resize(buf,(ulong)(uint)handler.size);
      }
      if ((uVar5 >> 0x14 & 1) == 0 && uVar11 != 0x200000000) {
        sVar3 = buf->size_;
        iVar6 = local_80;
        do {
          local_80 = iVar6;
          count = sVar3;
          if (count == 0) break;
          sVar3 = count - 1;
          iVar6 = local_80 + 1;
        } while (buf->ptr_[count - 1] == '0');
        buffer<char>::try_resize(buf,count);
      }
    }
  }
  return local_80;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}